

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int disp_nifti1_extension(char *mesg,nifti1_extension *ext,int maxlen)

{
  uint local_28;
  int len;
  int maxlen_local;
  nifti1_extension *ext_local;
  char *mesg_local;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stdout);
  }
  if (ext == (nifti1_extension *)0x0) {
    fprintf(_stderr,"** no extension to display\n");
    mesg_local._4_4_ = 1;
  }
  else {
    fprintf(_stdout,"ecode = %d, esize = %d, edata = ",(ulong)(uint)ext->ecode,
            (ulong)(uint)ext->esize);
    if (ext->edata == (char *)0x0) {
      fprintf(_stdout,"(NULL)\n");
    }
    else if ((ext->ecode == 4) || (ext->ecode == 6)) {
      local_28 = ext->esize - 8;
      if ((-1 < maxlen) && (maxlen < (int)local_28)) {
        local_28 = maxlen;
      }
      fprintf(_stdout,"%.*s\n",(ulong)local_28,ext->edata);
    }
    else {
      fprintf(_stdout,"(unknown data type)\n");
    }
    fflush(_stdout);
    mesg_local._4_4_ = 0;
  }
  return mesg_local._4_4_;
}

Assistant:

int disp_nifti1_extension(char *mesg, nifti1_extension * ext, int maxlen)
{
   int len;
   if( mesg ) fputs(mesg, stdout);

   if( !ext )
   {
      fprintf(stderr,"** no extension to display\n");
      return 1;
   }

   fprintf(stdout,"ecode = %d, esize = %d, edata = ",
           ext->ecode, ext->esize);

   if( !ext->edata )
      fprintf(stdout,"(NULL)\n");
   else if ( ext->ecode == NIFTI_ECODE_AFNI ||
             ext->ecode == NIFTI_ECODE_COMMENT )
   {
      len = ext->esize-8;
      if( maxlen >= 0 && len > maxlen ) len = maxlen;
      fprintf(stdout,"%.*s\n", len, (char *)ext->edata);
   }
   else
      fprintf(stdout,"(unknown data type)\n");

   fflush(stdout);

   return 0;
}